

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_test.cpp
# Opt level: O2

void __thiscall RotateFromTo_Simple_Test::TestBody(RotateFromTo_Simple_Test *this)

{
  char *pcVar1;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  Vector3<float> VVar6;
  Vector3f to;
  AssertHelper AStack_e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  AssertionResult gtest_ar;
  Tuple3<pbrt::Vector3,_float> local_c8;
  Tuple3<pbrt::Vector3,_float> local_b8;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Transform r;
  undefined1 auVar5 [56];
  
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  local_a8.z = 1.0;
  local_b8.z = 1.0;
  auVar5 = ZEXT856(0);
  pbrt::RotateFromTo(&r,(Vector3f)(ZEXT412(0x3f800000) << 0x40),
                     (Vector3f)(ZEXT412(0x3f800000) << 0x40));
  VVar6 = pbrt::Transform::operator()(&r,(Vector3<float> *)&local_a8);
  local_c8.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar2._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar2._8_56_ = auVar5;
  local_c8._0_8_ = vmovlps_avx(auVar2._0_16_);
  testing::internal::CmpHelperEQ<pbrt::Vector3<float>,pbrt::Vector3<float>>
            ((internal *)&gtest_ar,"to","toNew",(Vector3<float> *)&local_b8,
             (Vector3<float> *)&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform_test.cpp"
               ,0x50,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 1.0;
  local_b8._0_8_ = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  local_b8.z = 0.0;
  auVar5 = ZEXT856(0);
  to.super_Tuple3<pbrt::Vector3,_float>._0_8_ = SUB648(ZEXT464(0x3f800000),0);
  to.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  pbrt::RotateFromTo(&r,(Vector3f)(ZEXT412(0x3f800000) << 0x40),to);
  VVar6 = pbrt::Transform::operator()(&r,(Vector3<float> *)&local_a8);
  local_c8.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar5;
  local_c8._0_8_ = vmovlps_avx(auVar3._0_16_);
  testing::internal::CmpHelperEQ<pbrt::Vector3<float>,pbrt::Vector3<float>>
            ((internal *)&gtest_ar,"to","toNew",(Vector3<float> *)&local_b8,
             (Vector3<float> *)&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform_test.cpp"
               ,0x57,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 1.0;
  local_b8._0_8_ = vmovlps_avx(ZEXT816(0x3f80000000000000));
  local_b8.z = 0.0;
  auVar5 = ZEXT856(0);
  pbrt::RotateFromTo(&r,(Vector3f)(ZEXT412(0x3f800000) << 0x40),
                     (Vector3f)ZEXT812(0x3f80000000000000));
  VVar6 = pbrt::Transform::operator()(&r,(Vector3<float> *)&local_a8);
  local_c8.z = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  local_c8._0_8_ = vmovlps_avx(auVar4._0_16_);
  testing::internal::CmpHelperEQ<pbrt::Vector3<float>,pbrt::Vector3<float>>
            ((internal *)&gtest_ar,"to","toNew",(Vector3<float> *)&local_b8,
             (Vector3<float> *)&local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/transform_test.cpp"
               ,0x5e,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(RotateFromTo, Simple) {
    {
    // Same directions...
    Vector3f from(0,0,1), to(0, 0, 1);
    Transform r = RotateFromTo(from, to);
    Vector3f toNew = r(from);
    EXPECT_EQ(to, toNew);
    }

    {
    Vector3f from(0,0,1), to(1,0,0);
    Transform r = RotateFromTo(from, to);
    Vector3f toNew = r(from);
    EXPECT_EQ(to, toNew);
    }

    {
    Vector3f from(0,0,1), to(0,1,0);
    Transform r = RotateFromTo(from, to);
    Vector3f toNew = r(from);
    EXPECT_EQ(to, toNew);
    }
}